

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosYAML.cpp
# Opt level: O2

void adios2::helper::IOYAML(ADIOS *adios,Node *ioMap,IO *io,string *hint)

{
  bool bVar1;
  iterator iVar2;
  string *map;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *map_00;
  allocator local_341;
  string *local_340;
  IO *local_338;
  Node transportsSequence;
  Node variablesSequence;
  const_iterator __end3;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  Node engineMap;
  Params parameters;
  string local_100;
  string local_e0 [32];
  Params parameters_1;
  string local_90;
  Node local_70;
  
  std::__cxx11::string::string((string *)&local_240,"Engine",(allocator *)&parameters);
  map = hint;
  anon_unknown_0::YAMLNode(&engineMap,&local_240,ioMap,hint,false,Map);
  std::__cxx11::string::~string((string *)&local_240);
  if ((engineMap.m_isValid == true) &&
     ((engineMap.m_pNode == (node *)0x0 ||
      ((((((engineMap.m_pNode)->m_pRef).
          super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_pData).
        super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_isDefined
       == true)))) {
    anon_unknown_0::YAMLNodeMapToParams(&parameters,&engineMap,hint);
    std::__cxx11::string::string
              ((string *)&variablesSequence,"Type",(allocator *)&transportsSequence);
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&parameters._M_t,(key_type *)&variablesSequence);
    std::__cxx11::string::~string((string *)&variablesSequence);
    if ((_Rb_tree_header *)iVar2._M_node != &parameters._M_t._M_impl.super__Rb_tree_header) {
      std::__cxx11::string::string((string *)&transportsSequence,"Type",(allocator *)&__end3);
      EraseKey<std::__cxx11::string,std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &variablesSequence,(helper *)&transportsSequence,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parameters,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)map);
      std::__cxx11::string::~string((string *)&transportsSequence);
      std::__cxx11::string::string((string *)&local_90,(string *)&variablesSequence);
      core::IO::SetEngine(io,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&variablesSequence);
    }
    core::IO::SetParameters(io,(Params *)&parameters._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&parameters._M_t);
  }
  std::__cxx11::string::string((string *)&local_260,"Variables",(allocator *)&parameters);
  anon_unknown_0::YAMLNode(&variablesSequence,&local_260,ioMap,hint,false,Sequence);
  std::__cxx11::string::~string((string *)&local_260);
  if ((variablesSequence.m_isValid == true) &&
     ((variablesSequence.m_pNode == (node *)0x0 ||
      ((((((variablesSequence.m_pNode)->m_pRef).
          super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_pData).
        super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_isDefined
       == true)))) {
    YAML::Node::begin((const_iterator *)&transportsSequence,&variablesSequence);
    YAML::Node::end(&__end3,&variablesSequence);
    while( true ) {
      bVar1 = YAML::detail::node_iterator_base<YAML::detail::node>::operator!=
                        ((node_iterator_base<YAML::detail::node> *)&transportsSequence,
                         &__end3.m_iterator);
      if (!bVar1) break;
      YAML::detail::iterator_base<const_YAML::detail::iterator_value>::operator*
                ((value_type *)&parameters,
                 (iterator_base<const_YAML::detail::iterator_value> *)&transportsSequence);
      IOVariableYAML((Node *)&parameters,io,hint);
      YAML::detail::iterator_value::~iterator_value((value_type *)&parameters);
      YAML::detail::node_iterator_base<YAML::detail::node>::operator++
                ((node_iterator_base<YAML::detail::node> *)&transportsSequence);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&__end3.m_pMemory.
                super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&transportsSequence.m_pMemory);
  }
  std::__cxx11::string::string((string *)&local_280,"Transports",(allocator *)&parameters);
  anon_unknown_0::YAMLNode(&transportsSequence,&local_280,ioMap,hint,false,Sequence);
  std::__cxx11::string::~string((string *)&local_280);
  if ((transportsSequence.m_isValid == true) &&
     ((transportsSequence.m_pNode == (node *)0x0 ||
      ((((((transportsSequence.m_pNode)->m_pRef).
          super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_pData).
        super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_isDefined
       == true)))) {
    local_340 = hint;
    local_338 = io;
    YAML::Node::begin(&__end3,&transportsSequence);
    while( true ) {
      YAML::Node::end((const_iterator *)&parameters,&transportsSequence);
      bVar1 = YAML::detail::node_iterator_base<YAML::detail::node>::operator!=
                        (&__end3.m_iterator,(node_iterator_base<YAML::detail::node> *)&parameters);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &parameters._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (!bVar1) break;
      std::__cxx11::string::string((string *)&local_220,"Type",(allocator *)local_e0);
      YAML::detail::iterator_base<const_YAML::detail::iterator_value>::operator*
                ((value_type *)&parameters,&__end3);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &parameters_1," in transport node ",local_340);
      map_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parameters_1;
      anon_unknown_0::YAMLNode
                (&local_70,&local_220,(Node *)&parameters,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parameters_1,
                 true,Scalar);
      YAML::Node::~Node(&local_70);
      std::__cxx11::string::~string((string *)&parameters_1);
      YAML::detail::iterator_value::~iterator_value((value_type *)&parameters);
      std::__cxx11::string::~string((string *)&local_220);
      YAML::detail::iterator_base<const_YAML::detail::iterator_value>::operator*
                ((value_type *)&parameters,&__end3);
      anon_unknown_0::YAMLNodeMapToParams(&parameters_1,(Node *)&parameters,local_340);
      YAML::detail::iterator_value::~iterator_value((value_type *)&parameters);
      std::__cxx11::string::string(local_e0,"Type",&local_341);
      EraseKey<std::__cxx11::string,std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parameters,
                 (helper *)local_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parameters_1,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)map_00);
      std::__cxx11::string::~string(local_e0);
      std::__cxx11::string::string((string *)&local_100,(string *)&parameters);
      core::IO::AddTransport(local_338,&local_100,&parameters_1);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&parameters);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&parameters_1);
      YAML::detail::node_iterator_base<YAML::detail::node>::operator++(&__end3.m_iterator);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&__end3.m_pMemory.
                super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  YAML::Node::~Node(&transportsSequence);
  YAML::Node::~Node(&variablesSequence);
  YAML::Node::~Node(&engineMap);
  return;
}

Assistant:

void IOYAML(core::ADIOS &adios, const YAML::Node &ioMap, core::IO &io, const std::string &hint)
{
    // Engine parameters
    const YAML::Node engineMap = YAMLNode("Engine", ioMap, hint, false, YAML::NodeType::Map);

    if (engineMap)
    {
        Params parameters = YAMLNodeMapToParams(engineMap, hint);
        auto itType = parameters.find("Type");
        if (itType != parameters.end())
        {
            const std::string type = EraseKey<std::string>("Type", parameters);
            io.SetEngine(type);
        }
        io.SetParameters(parameters);
    }

    // Variables
    const YAML::Node variablesSequence =
        YAMLNode("Variables", ioMap, hint, false, YAML::NodeType::Sequence);

    if (variablesSequence)
    {
        // loop through each variable node
        for (const YAML::Node &variableMap : variablesSequence)
        {
            IOVariableYAML(variableMap, io, hint);
        }
    }

    // Transports
    const YAML::Node transportsSequence =
        YAMLNode("Transports", ioMap, hint, false, YAML::NodeType::Sequence);

    if (transportsSequence)
    {
        // loop through each transport node
        for (auto it = transportsSequence.begin(); it != transportsSequence.end(); ++it)
        {
            YAMLNode("Type", *it, " in transport node " + hint, isMandatory,
                     YAML::NodeType::Scalar);

            Params parameters = YAMLNodeMapToParams(*it, hint);
            const std::string type = EraseKey<std::string>("Type", parameters);

            io.AddTransport(type, parameters);
        }
    }
}